

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O0

gboolean media_player2_player_skeleton_get_can_play(MediaPlayer2Player *object)

{
  gboolean gVar1;
  GType GVar2;
  long lVar3;
  gboolean value;
  MediaPlayer2PlayerSkeleton *skeleton;
  MediaPlayer2Player *object_local;
  
  GVar2 = media_player2_player_skeleton_get_type();
  lVar3 = g_type_check_instance_cast(object,GVar2);
  g_mutex_lock(*(long *)(lVar3 + 0x20) + 0x20);
  gVar1 = g_value_get_boolean(**(long **)(lVar3 + 0x20) + 0x108);
  g_mutex_unlock(*(long *)(lVar3 + 0x20) + 0x20);
  return gVar1;
}

Assistant:

static gboolean 
media_player2_player_skeleton_get_can_play (MediaPlayer2Player *object)
{
  MediaPlayer2PlayerSkeleton *skeleton = MEDIA_PLAYER2_PLAYER_SKELETON (object);
  gboolean value;
  g_mutex_lock (&skeleton->priv->lock);
  value = g_value_get_boolean (&(skeleton->priv->properties[11]));
  g_mutex_unlock (&skeleton->priv->lock);
  return value;
}